

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_set_test.cc
# Opt level: O2

void __thiscall
phmap::priv::anon_unknown_5::FlatHashSet_BitfieldArgument_Test::TestBody
          (FlatHashSet_BitfieldArgument_Test *this)

{
  anon_union_8_1_a8a14541_for_iterator_1 extraout_RDX;
  const_iterator cVar1;
  flat_hash_set<int,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_> s;
  allocator_type local_66;
  key_equal local_65;
  int local_64;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>::iterator,_phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>::iterator>
  local_60;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  local_40;
  
  local_60.first.ctrl_._0_4_ = 0;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
  ::raw_hash_set<int_const*>
            ((raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
              *)&local_40,(int *)&local_60,(int *)((long)&local_60.first.ctrl_ + 4),0,
             (hasher *)&local_64,&local_65,&local_66);
  local_64 = 0;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::emplace<const_int_&,_0>
            ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>::iterator,_bool>
              *)&local_60,&local_40,&local_64);
  cVar1.inner_.ctrl_ = local_40.ctrl_ + local_40.capacity_;
  local_60.first.ctrl_._0_4_ = 0;
  cVar1.inner_.field_1.slot_ = extraout_RDX.slot_;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::insert<int,_0,_0>(&local_40,cVar1,(int *)&local_60);
  local_60.first.ctrl_._0_4_ = 0;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::insert<const_int_*,_0>(&local_40,(int *)&local_60,(int *)((long)&local_60.first.ctrl_ + 4));
  local_60.first.ctrl_._0_4_ = 0;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::erase<int>(&local_40,(key_arg<int> *)&local_60);
  local_60.first.ctrl_._0_4_ = 0;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::count<int>(&local_40,(key_arg<int> *)&local_60);
  local_60.first.ctrl_._0_4_ = 0;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::prefetch<int>(&local_40,(key_arg<int> *)&local_60);
  local_60.first.ctrl_._0_4_ = 0;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::find<int>(&local_40,(key_arg<int> *)&local_60);
  local_60.first.ctrl_._0_4_ = 0;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::contains<int>(&local_40,(key_arg<int> *)&local_60);
  local_64 = 0;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::equal_range<int>(&local_60,&local_40,&local_64);
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::~raw_hash_set(&local_40);
  return;
}

Assistant:

size_t operator()(const std::unique_ptr<int>& p) const { return *p; }